

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::serialize
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,string *str)

{
  bool bVar1;
  EVP_PKEY_CTX *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000008;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>_>_>
  *in_stack_00000010;
  basic_dynamic_counter<long,_(unsigned_char)__x02_> *in_stack_00000018;
  string value_str;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>_>_>
  map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  _Alloc_hider in_stack_ffffffffffffffb0;
  
  dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::copy
            ((dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_> *)
             &stack0xffffffffffffffd8,(EVP_PKEY_CTX *)in_RDI,in_RDX);
  bVar1 = std::
          vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair>_>_>
          ::empty((vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>_>_>
                   *)in_stack_ffffffffffffffa0);
  if (!bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffffb0;
    std::__cxx11::string::string(in_stack_ffffffffffffffa0);
    basic_dynamic_counter<long,(unsigned_char)2>::
    serialize_map<std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::metric_pair>,std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::metric_pair>>>>
              (in_stack_00000018,in_stack_00000010,in_stack_00000008);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f03be
                      );
    if (!bVar1) {
      metric_t::serialize_head((metric_t *)in_stack_ffffffffffffffb0._M_p,in_stack_ffffffffffffffa8)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_ffffffffffffffa0,in_RDI);
    }
    std::__cxx11::string::~string(this_00);
  }
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair>_>_>
  ::~vector((vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>_>_>
             *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto map = Base::copy();
    if (map.empty()) {
      return;
    }

    std::string value_str;
    serialize_map(map, value_str);
    if (!value_str.empty()) {
      Base::serialize_head(str);
      str.append(value_str);
    }
  }